

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cc
# Opt level: O2

TimeTscPair absl::lts_20250127::base_internal::GetTimeTscPair(void)

{
  ulong uVar1;
  int64_t iVar2;
  int64_t iVar3;
  int64_t unaff_RBX;
  int iVar4;
  long lVar5;
  ulong unaff_R14;
  bool bVar6;
  TimeTscPair TVar7;
  
  iVar4 = 10;
  lVar5 = 0x7fffffffffffffff;
  while (bVar6 = iVar4 != 0, iVar4 = iVar4 + -1, bVar6) {
    iVar2 = ReadMonotonicClockNanos();
    uVar1 = rdtsc();
    iVar3 = ReadMonotonicClockNanos();
    if (iVar3 - iVar2 < lVar5) {
      unaff_RBX = iVar2;
      lVar5 = iVar3 - iVar2;
      unaff_R14 = uVar1 & 0xffffffff00000000 | CONCAT44((int)((ulong)iVar2 >> 0x20),(int)uVar1);
    }
  }
  TVar7.tsc = unaff_R14;
  TVar7.time = unaff_RBX;
  return TVar7;
}

Assistant:

static TimeTscPair GetTimeTscPair() {
  int64_t best_latency = std::numeric_limits<int64_t>::max();
  TimeTscPair best;
  for (int i = 0; i < 10; ++i) {
    int64_t t0 = ReadMonotonicClockNanos();
    int64_t tsc = UnscaledCycleClockWrapperForInitializeFrequency::Now();
    int64_t t1 = ReadMonotonicClockNanos();
    int64_t latency = t1 - t0;
    if (latency < best_latency) {
      best_latency = latency;
      best.time = t0;
      best.tsc = tsc;
    }
  }
  return best;
}